

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

int search::negamax(int alpha,int beta,int depth,Board *pos,SearchInfo *info,PVTable *pvtable)

{
  long lVar1;
  pointer pMVar2;
  pointer pMVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  ulong uVar10;
  int iVar11;
  Move MVar12;
  int depth_00;
  int iVar13;
  int iVar14;
  bool bVar15;
  Move move;
  Move bestMove;
  vector<board::Move,_std::allocator<board::Move>_> moves;
  int local_bc;
  MoveList local_98;
  SearchInfo *local_80;
  Move local_78;
  vector<board::Move,_std::allocator<board::Move>_> local_70;
  int (*local_58) [120];
  Move local_50;
  Move local_48;
  Move local_40;
  Move local_38;
  
  if ((info->nodes & 0x7ff) == 0) {
    checkup(info);
  }
  info->nodes = info->nodes + 1;
  bVar4 = isRepetition(pos);
  if ((pos->fiftyMove < 100 && !bVar4) || (local_bc = 0, pos->ply < 1)) {
    piVar9 = &pos->side;
    if (pos->side == 0) {
      piVar9 = pos->board + 0x3c;
    }
    bVar4 = board::Board::sqAttacked(pos,(*(int (*) [10])(piVar9 + 0x86))[0],pos->side ^ 1);
    iVar6 = (uint)bVar4 + depth;
    if (iVar6 == 0) {
      iVar7 = board::evaluate::score(pos);
      if (alpha < iVar7) {
        alpha = iVar7;
      }
      if (beta <= iVar7) {
        return beta;
      }
    }
    movegen::generateAll(&local_98,pos,iVar6 == 0);
    std::vector<board::Move,_std::allocator<board::Move>_>::vector(&local_70,&local_98.moves);
    if ((Move)local_98.moves.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
              super__Vector_impl_data._M_start != (Move)0x0) {
      operator_delete(local_98.moves.super__Vector_base<board::Move,_std::allocator<board::Move>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.moves.
                            super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.moves.
                            super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    PVTable::getMove(pvtable,pos);
    pMVar3 = local_70.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pMVar2 = local_70.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_78.value = 0;
    local_78.score = 0;
    local_80 = info;
    if ((long)local_70.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_70.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      local_98.moves.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_70.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_38 = (Move)local_70.super__Vector_base<board::Move,_std::allocator<board::Move>_>.
                       _M_impl.super__Vector_impl_data._M_start;
      uVar10 = (long)local_70.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_70.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      lVar1 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      std::
      __introsort_loop<std::reverse_iterator<__gnu_cxx::__normal_iterator<board::Move*,std::vector<board::Move,std::allocator<board::Move>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (&local_98,&local_38,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
      local_40 = (Move)pMVar3;
      local_48 = (Move)pMVar2;
      std::
      __final_insertion_sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<board::Move*,std::vector<board::Move,std::allocator<board::Move>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ();
    }
    local_50 = (Move)local_70.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    bVar15 = local_70.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
             super__Vector_impl_data._M_start ==
             local_70.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_bc = beta;
    iVar7 = alpha;
    if (bVar15) {
      bVar5 = true;
    }
    else {
      depth_00 = iVar6 + -1;
      iVar13 = 0;
      if (iVar6 < 1) {
        depth_00 = 0;
      }
      local_58 = pos->searchHistory;
      MVar12 = (Move)local_70.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
                     super__Vector_impl_data._M_start;
      do {
        local_98.moves.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)MVar12;
        bVar5 = board::makemove::move((Move *)&local_98,pos);
        iVar11 = 5;
        if (bVar5) {
          iVar8 = negamax(-beta,-iVar7,depth_00,pos,local_80,pvtable);
          board::makemove::undo(pos);
          iVar13 = iVar13 + 1;
          iVar11 = 1;
          if (local_80->stopped == false) {
            iVar14 = -iVar8;
            if (SBORROW4(iVar7,iVar14) == iVar7 + iVar8 < 0) {
              iVar11 = 0;
            }
            else if (iVar14 < beta) {
              local_78 = (Move)local_98.moves.
                               super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl
                               .super__Vector_impl_data._M_start;
              if ((0 < iVar6) &&
                 (((ulong)local_98.moves.
                          super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
                          super__Vector_impl_data._M_start & 0x7c000) == 0)) {
                piVar9 = (int *)((long)local_58[pos->board
                                                [(uint)local_98.moves.
                                                                                                              
                                                  super__Vector_base<board::Move,_std::allocator<board::Move>_>
                                                  ._M_impl.super__Vector_impl_data._M_start & 0x7f]]
                                + (ulong)((uint)local_98.moves.
                                                super__Vector_base<board::Move,_std::allocator<board::Move>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 5 &
                                         0x1fc));
                *piVar9 = *piVar9 + iVar6;
              }
              iVar11 = 0;
              iVar7 = iVar14;
            }
            else {
              local_bc = beta;
              if ((0 < iVar6) &&
                 (((ulong)local_98.moves.
                          super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
                          super__Vector_impl_data._M_start & 0x7c000) == 0)) {
                pos->searchKillers[1][pos->ply] = pos->searchKillers[0][pos->ply];
                pos->searchKillers[0][pos->ply] =
                     (uint)local_98.moves.
                           super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
                           super__Vector_impl_data._M_start;
              }
            }
          }
          else {
            local_bc = 0;
          }
        }
        if ((iVar11 != 5) && (iVar11 != 0)) break;
        MVar12 = (Move)((long)MVar12 + 8);
        bVar15 = MVar12 == local_50;
      } while (!bVar15);
      bVar5 = iVar13 == 0;
    }
    if (bVar15) {
      if ((bool)(0 < iVar6 & bVar5)) {
        local_bc = 0;
        if (bVar4) {
          local_bc = pos->ply + -0x7ffffffe;
        }
      }
      else {
        local_bc = iVar7;
        if (iVar7 != alpha) {
          PVTable::addMove(pvtable,pos,&local_78);
        }
      }
    }
    if ((Move)local_70.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
              super__Vector_impl_data._M_start != (Move)0x0) {
      operator_delete(local_70.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_70.super__Vector_base<board::Move,_std::allocator<board::Move>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.super__Vector_base<board::Move,_std::allocator<board::Move>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return local_bc;
}

Assistant:

int search::negamax(int alpha, int beta, int depth, board::Board& pos, SearchInfo& info, PVTable& pvtable)
{
    if ((info.getNodes() & 2047) == 0) {
        checkup(info);
    }
    info.incrementNodes();
    if ((isRepetition(pos) || pos.getFiftyMove() >= 100) && pos.getPly() > 0) {
        return 0;
    }
    bool inCheck =
        pos.sqAttacked(pos.getPieceList(pos.getSide() == board::WHITE ? board::WK : board::BK)[0], pos.getSide() ^ 1);
    if (inCheck) {
        depth++;
    }
    if (depth == 0) {
        int score = board::evaluate::score(pos);
        if (score >= beta) {
            return beta;
        }
        if (score > alpha) {
            alpha = score;
        }
    }
    std::vector<board::Move> moves = movegen::generateAll(pos, depth == 0).getMoves();
    board::Move pvMove = pvtable.getMove(pos);
    if (pvMove.getValue() != 0) {
        for (board::Move move : moves) {
            if (pvMove.getValue() == move.getValue()) {
                move.addScore(2000000);
                break;
            }
        }
    }
    board::Move bestMove;
    int legal = 0;
    int oldAlpha = alpha;
    int score = NEG_INFINITY;
    std::sort(moves.rbegin(), moves.rend());
    for (board::Move move : moves) {
        if (!board::makemove::move(move, pos)) {
            continue;
        }
        legal++;
        score = -negamax(-beta, -alpha, depth > 0 ? depth - 1 : 0, pos, info, pvtable);
        board::makemove::undo(pos);
        if (info.getStopped()) {
            return 0;
        }
        if (score > alpha) {
            if (score >= beta) {
                if (depth > 0) {
                    if (!(move.getValue() & board::Move::MFLAGCAP)) {
                        pos.addSearchKiller(move.getValue());
                    }
                }
                return beta;
            }
            alpha = score;
            bestMove = move;
            if (depth > 0) {
                if (!(move.getValue() & board::Move::MFLAGCAP)) {
                    pos.incrementSearchHistory(board::Move::TOSQ(move.getValue()), board::Move::FROMSQ(move.getValue()),
                                               depth);
                }
            }
        }
    }
    if (depth > 0 && legal == 0) {
        if (inCheck) {
            return -POS_INFINITY + pos.getPly();
        }
        return 0;
    }
    if (alpha != oldAlpha) {
        pvtable.addMove(pos, bestMove);
    }
    return alpha;
}